

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

semantic_tag __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::tag
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *this)

{
  byte bVar1;
  
  for (; (bVar1 = (byte)((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>_5
                          *)&((pointer)this)->
                             super_heap_string_base<unsigned_long,_std::allocator<wchar_t>_>)->
                        json_const_pointer_ & 0xf, bVar1 == 9 || (bVar1 == 8));
      this = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>_5
                *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<wchar_t>_>)
             ->byte_str_).ptr_) {
  }
  return *(semantic_tag *)
          ((long)&(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<wchar_t>_>)
                  .extra_ + 1);
}

Assistant:

semantic_tag tag() const
        {
            // It is legal to access 'common_.tag_' even though 
            // common_ is not the active member of the union because 'tag_' 
            // is a part of the common initial sequence of all union members
            // as defined in 11.4-25 of the Standard.
            switch(storage_kind())
            {
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().tag();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().tag();
                default:
                    return common_.tag_;
            }
        }